

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FCS.cpp
# Opt level: O2

uint32_t FCS::ChecksumAdd(uint8_t *buffer,int length,uint32_t checksum)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (long)length / 2 & 0xffffffff;
  if ((int)((long)length / 2) < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    checksum = checksum +
               (ushort)(*(ushort *)(buffer + uVar2 * 2) << 8 | *(ushort *)(buffer + uVar2 * 2) >> 8)
    ;
  }
  return checksum;
}

Assistant:

uint32_t FCS::ChecksumAdd(const uint8_t* buffer, int length, uint32_t checksum)
{
    uint16_t value;
    int32_t i;

    // Don't need to add in the checksum field so only 9x16 bit words in header
    for (i = 0; i < length / 2; i++)
    {
        value = (buffer[i * 2] << 8) | buffer[i * 2 + 1];
        checksum += (uint32_t)value;
    }

    return checksum;
}